

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelDefinesByProperties::~IfcRelDefinesByProperties
          (IfcRelDefinesByProperties *this)

{
  bitset<1UL> *pbVar1;
  void *pvVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  
  *(undefined8 *)&this[-1].super_IfcRelDefines.field_0x30 = 0x814f78;
  *(undefined8 *)&(this->super_IfcRelDefines).field_0x18 = 0x814ff0;
  *(undefined8 *)
   &this[-1].super_IfcRelDefines.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>.
    field_0x20 = 0x814fa0;
  *(undefined8 *)&this[-1].super_IfcRelDefines.field_0xc8 = 0x814fc8;
  pvVar2 = *(void **)&this[-1].field_0xd8;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)&this[-1].field_0xe8 - (long)pvVar2);
  }
  *(undefined8 *)&this[-1].super_IfcRelDefines.field_0x30 = 0x815090;
  *(undefined8 *)&(this->super_IfcRelDefines).field_0x18 = 0x8150b8;
  puVar3 = *(undefined1 **)&this[-1].super_IfcRelDefines.field_0x90;
  pbVar1 = &this[-1].super_IfcRelDefines.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>.aux_is_derived;
  if ((bitset<1UL> *)puVar3 != pbVar1) {
    operator_delete(puVar3,(pbVar1->super__Base_bitset<1UL>)._M_w + 1);
  }
  puVar4 = *(undefined1 **)&this[-1].super_IfcRelDefines.field_0x68;
  puVar3 = &this[-1].super_IfcRelDefines.field_0x78;
  if (puVar4 != puVar3) {
    operator_delete(puVar4,*(long *)puVar3 + 1);
  }
  puVar3 = *(undefined1 **)&this[-1].super_IfcRelDefines.field_0x40;
  puVar4 = &this[-1].super_IfcRelDefines.field_0x50;
  if (puVar3 != puVar4) {
    operator_delete(puVar3,*(long *)puVar4 + 1);
    return;
  }
  return;
}

Assistant:

IfcRelDefinesByProperties() : Object("IfcRelDefinesByProperties") {}